

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_request.c
# Opt level: O1

int tnt_request_set_funcz(tnt_request *req,char *func)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = -1;
  if ((func != (char *)0x0) && (((req->hdr).type - TNT_OP_CALL_16 & 0xfffffffb) == 0)) {
    req->key = func;
    sVar2 = strlen(func);
    req->key_end = func + sVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
tnt_request_set_funcz(struct tnt_request *req, const char *func)
{
	if (!is_call(req->hdr.type))
		return -1;
	if (!func)
		return -1;
	req->key = func; req->key_end = req->key + strlen(req->key);
	return 0;
}